

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipm.cc
# Opt level: O2

void __thiscall ipx::IPM::StepSizes(IPM *this,Step *step,bool isCentring)

{
  double **ppdVar1;
  double **ppdVar2;
  Iterate *pIVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double *pdVar7;
  double **ppdVar8;
  double **ppdVar9;
  double **ppdVar10;
  double **ppdVar11;
  double *pdVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  double *pdVar17;
  int *piVar18;
  Int *pIVar19;
  double in_XMM0_Qa;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [16];
  double dVar25;
  double dVar26;
  double dVar27;
  Int block_zu;
  Int block_xu;
  Int block_xl;
  Int block_zl;
  Int local_5c;
  Int local_58;
  Int local_54;
  double local_50;
  double local_48;
  IPM *local_40;
  Int local_34;
  
  pIVar3 = this->iterate_;
  uVar14 = pIVar3->model_->num_cols_ + pIVar3->model_->num_rows_;
  local_40 = this;
  local_48 = StepToBoundary(&pIVar3->xl_,&step->xl,&local_54,in_XMM0_Qa);
  local_50 = StepToBoundary(&pIVar3->xu_,&step->xu,&local_58,local_48);
  dVar20 = StepToBoundary(&pIVar3->zl_,&step->zl,&local_34,local_50);
  dVar21 = StepToBoundary(&pIVar3->zu_,&step->zu,&local_5c,dVar20);
  dVar22 = fmin(local_48,local_50);
  dVar23 = fmin(dVar20,dVar21);
  ppdVar10 = &(pIVar3->xl_)._M_data;
  pdVar4 = (step->xl)._M_data;
  pdVar5 = (step->xu)._M_data;
  ppdVar11 = &(pIVar3->zl_)._M_data;
  pdVar12 = (step->zl)._M_data;
  ppdVar1 = &(pIVar3->xu_)._M_data;
  ppdVar2 = &(pIVar3->zu_)._M_data;
  uVar16 = 0;
  uVar15 = (ulong)uVar14;
  if ((int)uVar14 < 1) {
    uVar15 = uVar16;
  }
  pdVar6 = (step->zu)._M_data;
  dVar25 = 0.0;
  iVar13 = 0;
  for (; uVar15 * 4 != uVar16; uVar16 = uVar16 + 4) {
    uVar14 = *(uint *)((long)(pIVar3->variable_state_).
                             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
                             ._M_impl.super__Vector_impl_data._M_start + uVar16);
    if ((uVar14 & 0xfffffffd) == 0) {
      dVar25 = dVar25 + (*(double *)((long)pdVar12 + uVar16 * 2) * dVar23 +
                        *(double *)((long)*ppdVar11 + uVar16 * 2)) *
                        (*(double *)((long)pdVar4 + uVar16 * 2) * dVar22 +
                        *(double *)((long)*ppdVar10 + uVar16 * 2));
      iVar13 = iVar13 + 1;
    }
    if (uVar14 - 1 < 2) {
      dVar25 = dVar25 + (*(double *)((long)pdVar6 + uVar16 * 2) * dVar23 +
                        *(double *)((long)*ppdVar2 + uVar16 * 2)) *
                        (*(double *)((long)pdVar5 + uVar16 * 2) * dVar22 +
                        *(double *)((long)*ppdVar1 + uVar16 * 2));
      iVar13 = iVar13 + 1;
    }
  }
  dVar26 = (dVar25 / (double)iVar13) / 10.000000000000002;
  dVar25 = 1.0;
  if (dVar22 < 1.0) {
    pdVar17 = pdVar4;
    pdVar7 = pdVar12;
    ppdVar8 = ppdVar11;
    ppdVar9 = ppdVar10;
    if (local_50 < local_48) {
      pdVar17 = pdVar5;
      pdVar7 = pdVar6;
      ppdVar8 = ppdVar2;
      ppdVar9 = ppdVar1;
    }
    piVar18 = &local_54;
    if (local_50 < local_48) {
      piVar18 = &local_58;
    }
    iVar13 = *piVar18;
    dVar25 = ((*ppdVar9)[iVar13] - dVar26 / (pdVar7[iVar13] * dVar23 + (*ppdVar8)[iVar13])) /
             -pdVar17[iVar13];
    dVar27 = dVar22 * 0.9;
    if (dVar22 * 0.9 <= dVar25) {
      dVar27 = dVar25;
    }
    dVar25 = 1.0;
    if (dVar27 <= 1.0) {
      dVar25 = dVar27;
    }
  }
  dVar27 = 1.0;
  if (dVar23 < 1.0) {
    if (dVar21 < dVar20) {
      pdVar12 = pdVar6;
      pdVar4 = pdVar5;
      ppdVar10 = ppdVar1;
      ppdVar11 = ppdVar2;
    }
    pIVar19 = &local_34;
    if (dVar21 < dVar20) {
      pIVar19 = &local_5c;
    }
    iVar13 = *pIVar19;
    dVar21 = ((*ppdVar11)[iVar13] - dVar26 / (pdVar4[iVar13] * dVar22 + (*ppdVar10)[iVar13])) /
             -pdVar12[iVar13];
    dVar20 = dVar23 * 0.9;
    if (dVar23 * 0.9 <= dVar21) {
      dVar20 = dVar21;
    }
    dVar27 = 1.0;
    if (dVar20 <= 1.0) {
      dVar27 = dVar20;
    }
  }
  auVar24._8_8_ = dVar27;
  auVar24._0_8_ = dVar25;
  auVar24 = minpd(_DAT_003b7190,auVar24);
  local_40->step_primal_ = (double)auVar24._0_8_;
  local_40->step_dual_ = (double)auVar24._8_8_;
  if (isCentring) {
    dVar20 = (local_40->control_->parameters_).super_ipx_parameters.centring_alpha_scaling;
    local_40->step_primal_ = dVar25 * dVar20;
    local_40->step_dual_ = dVar27 * dVar20;
  }
  return;
}

Assistant:

void IPM::StepSizes(const Step& step, bool isCentring) {
    const Model& model = iterate_->model();
    const Int m = model.rows();
    const Int n = model.cols();
    const Vector& xl = iterate_->xl();
    const Vector& xu = iterate_->xu();
    const Vector& zl = iterate_->zl();
    const Vector& zu = iterate_->zu();
    const Vector& dxl = step.xl;
    const Vector& dxu = step.xu;
    const Vector& dzl = step.zl;
    const Vector& dzu = step.zu;
    const double gammaf = 0.9;
    const double gammaa = 1.0 / (1.0-gammaf);

    Int block_xl, block_xu, block_zl, block_zu;
    double step_xl = StepToBoundary(xl, dxl, &block_xl);
    double step_xu = StepToBoundary(xu, dxu, &block_xu);
    double step_zl = StepToBoundary(zl, dzl, &block_zl);
    double step_zu = StepToBoundary(zu, dzu, &block_zu);
    double maxp = std::fmin(step_xl, step_xu);
    double maxd = std::fmin(step_zl, step_zu);
    double mufull = 0.0;
    Int num_finite = 0;
    for (Int j = 0; j < n+m; j++) {
        if (iterate_->has_barrier_lb(j)) {
            assert(std::isfinite(xl[j]));
            assert(xl[j] != 0.0);
            mufull += (xl[j]+maxp*dxl[j]) * (zl[j]+maxd*dzl[j]);
            num_finite++;
        }
        if (iterate_->has_barrier_ub(j)) {
            assert(std::isfinite(xu[j]));
            assert(xu[j] != 0.0);
            mufull += (xu[j]+maxp*dxu[j]) * (zu[j]+maxd*dzu[j]);
            num_finite++;
        }
    }
    assert(std::isfinite(mufull));
    mufull /= num_finite;
    mufull /= gammaa;

    double alphap = 1.0;
    double alphad = 1.0;
    Int blockp = -1;
    Int blockd = -1;
    if (maxp < 1.0) {
        if (step_xl <= step_xu) {
            double buffer;
            blockp = block_xl;
            buffer = mufull / (zl[blockp] + maxd*dzl[blockp]);
            alphap = (xl[blockp]-buffer) / (-dxl[blockp]);
        } else {
            double buffer;
            blockp = block_xu;
            buffer = mufull / (zu[blockp] + maxd*dzu[blockp]);
            alphap = (xu[blockp]-buffer) / (-dxu[blockp]);
        }
        alphap = std::max(alphap, gammaf*maxp);
        alphap = std::min(alphap, 1.0);
        assert(blockp >= 0.0);
    }
    if (maxd < 1.0) {
        if (step_zl <= step_zu) {
            double buffer;
            blockd = block_zl;
            buffer = mufull / (xl[blockd] + maxp*dxl[blockd]);
            alphad = (zl[blockd]-buffer) / (-dzl[blockd]);
        } else {
            double buffer;
            blockd = block_zu;
            buffer = mufull / (xu[blockd] + maxp*dxu[blockd]);
            alphad = (zu[blockd]-buffer) / (-dzu[blockd]);
        }
        alphad = std::max(alphad, gammaf*maxd);
        alphad = std::min(alphad, 1.0);
        assert(blockd >= 0.0);
    }
    step_primal_ = std::min(alphap, 1.0-1e-6);
    step_dual_   = std::min(alphad, 1.0-1e-6);

    if (isCentring){
        // When computing stepsizes for a centring step, reduce them
        // by centringAlphaScaling. This ensures that the point is 
        // well centred and does not get too close to the boundary.
        step_primal_ = alphap * control_.centringAlphaScaling();
        step_dual_ = alphad * control_.centringAlphaScaling();
    }
}